

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA *handleData)

{
  size_t sVar1;
  ulong uVar2;
  char **ppcVar3;
  LOGGER_LOG p_Var4;
  ulong uVar5;
  
  sVar1 = handleData->count;
  if (sVar1 == 0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    if (sVar1 == 1) {
      free(handleData->keys);
      handleData->keys = (char **)0x0;
      free(handleData->values);
      handleData->mapFilterCallback = (MAP_FILTER_CALLBACK)0x0;
      handleData->values = (char **)0x0;
      handleData->count = 0;
      return;
    }
    uVar2 = sVar1 - 1;
  }
  uVar5 = uVar2 >> 0x3d;
  uVar2 = -(ulong)(uVar5 != 0) | uVar2 << 3;
  if ((uVar5 == 0) && (ppcVar3 = (char **)realloc(handleData->keys,uVar2), ppcVar3 != (char **)0x0))
  {
    handleData->keys = ppcVar3;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_DecreaseStorageKeysValues",0xf0,1,
                "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
                uVar2);
    }
  }
  if ((uVar5 == 0) &&
     (ppcVar3 = (char **)realloc(handleData->values,uVar2), ppcVar3 != (char **)0x0)) {
    handleData->values = ppcVar3;
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_DecreaseStorageKeysValues",0xfa,1,
                "CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu",
                uVar2);
    }
  }
  handleData->count = handleData->count - 1;
  return;
}

Assistant:

static void Map_DecreaseStorageKeysValues(MAP_HANDLE_DATA* handleData)
{
    if (handleData->count == 1)
    {
        free(handleData->keys);
        handleData->keys = NULL;
        free(handleData->values);
        handleData->values = NULL;
        handleData->count = 0;
        handleData->mapFilterCallback = NULL;
    }
    else
    {
        /*certainly > 1...*/
        char** undoneValues;
        char** undoneKeys;
        size_t realloc_size = safe_subtract_size_t(handleData->count, 1);
        realloc_size = safe_multiply_size_t(realloc_size, sizeof(char*));

        if (realloc_size == SIZE_MAX ||
            (undoneKeys = (char**)realloc(handleData->keys, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->keys = undoneKeys;
        }

        if (realloc_size == SIZE_MAX || 
            (undoneValues = (char**)realloc(handleData->values, realloc_size)) == NULL)
        {
            LogError("CATASTROPHIC error, unable to undo through realloc to a smaller size, size:%zu", realloc_size);
        }
        else
        {
            handleData->values = undoneValues;
        }

        handleData->count--;
    }
}